

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md4.c
# Opt level: O0

void Curl_md4it(uchar *output,uchar *input,size_t len)

{
  uint uVar1;
  undefined1 local_b8 [8];
  MD4_CTX ctx;
  size_t len_local;
  uchar *input_local;
  uchar *output_local;
  
  ctx.block._56_8_ = len;
  MD4_Init((MD4_CTX *)local_b8);
  uVar1 = curlx_uztoui(ctx.block._56_8_);
  MD4_Update((MD4_CTX *)local_b8,input,(ulong)uVar1);
  MD4_Final(output,(MD4_CTX *)local_b8);
  return;
}

Assistant:

void Curl_md4it(unsigned char *output, const unsigned char *input,
                const size_t len)
{
  MD4_CTX ctx;

  MD4_Init(&ctx);
  MD4_Update(&ctx, input, curlx_uztoui(len));
  MD4_Final(output, &ctx);
}